

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

ScalarFunction * duckdb::StatsFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  FunctionNullHandling in_stack_ffffffffffffff58;
  allocator_type local_a1;
  code *bind_lambda;
  LogicalType local_80;
  vector<duckdb::LogicalType,_true> local_68;
  LogicalType local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType(&local_38,ANY);
  __l._M_len = 1;
  __l._M_array = &local_38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68,__l,
             &local_a1);
  LogicalType::LogicalType(&local_80,VARCHAR);
  bind_lambda = StatsFunction;
  LogicalType::LogicalType(&local_50,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,&local_68,&local_80,(scalar_function_t *)&stack0xffffffffffffff60,StatsBind,
             (bind_scalar_function_extended_t)0x0,StatsPropagateStats,(init_local_state_t)0x0,
             (LogicalType)ZEXT824(&local_50),CONSISTENT,in_stack_ffffffffffffff58,bind_lambda);
  LogicalType::~LogicalType(&local_50);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff60,(_Any_data *)&stack0xffffffffffffff60,
               __destroy_functor);
  LogicalType::~LogicalType(&local_80);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  LogicalType::~LogicalType(&local_38);
  (in_RDI->super_BaseScalarFunction).stability = VOLATILE;
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return in_RDI;
}

Assistant:

ScalarFunction StatsFun::GetFunction() {
	ScalarFunction stats({LogicalType::ANY}, LogicalType::VARCHAR, StatsFunction, StatsBind, nullptr,
	                     StatsPropagateStats);
	stats.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	stats.stability = FunctionStability::VOLATILE;
	return stats;
}